

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

float * GetStyleVarFloatAddr(ImGuiStyleVar idx)

{
  ImGuiContext *g;
  ImGuiStyle *pIStack_10;
  ImGuiStyleVar idx_local;
  
  switch(idx) {
  case 0:
    pIStack_10 = &GImGui->Style;
    break;
  default:
    pIStack_10 = (ImGuiStyle *)0x0;
    break;
  case 2:
    pIStack_10 = (ImGuiStyle *)&(GImGui->Style).WindowRounding;
    break;
  case 4:
    pIStack_10 = (ImGuiStyle *)&(GImGui->Style).ChildWindowRounding;
    break;
  case 6:
    pIStack_10 = (ImGuiStyle *)&(GImGui->Style).FrameRounding;
    break;
  case 9:
    pIStack_10 = (ImGuiStyle *)&(GImGui->Style).IndentSpacing;
    break;
  case 10:
    pIStack_10 = (ImGuiStyle *)&(GImGui->Style).GrabMinSize;
  }
  return &pIStack_10->Alpha;
}

Assistant:

static float* GetStyleVarFloatAddr(ImGuiStyleVar idx)
{
    ImGuiContext& g = *GImGui;
    switch (idx)
    {
    case ImGuiStyleVar_Alpha: return &g.Style.Alpha;
    case ImGuiStyleVar_WindowRounding: return &g.Style.WindowRounding;
    case ImGuiStyleVar_ChildWindowRounding: return &g.Style.ChildWindowRounding;
    case ImGuiStyleVar_FrameRounding: return &g.Style.FrameRounding;
    case ImGuiStyleVar_IndentSpacing: return &g.Style.IndentSpacing;
    case ImGuiStyleVar_GrabMinSize: return &g.Style.GrabMinSize;
    }
    return NULL;
}